

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

void __thiscall Debug::PosixCrashHandler::~PosixCrashHandler(PosixCrashHandler *this)

{
  PosixCrashHandler *this_local;
  
  free(this->m_stackMemory);
  free(this->m_demangleMemory);
  std::__cxx11::string::~string((string *)&this->m_backtraceFilePath);
  std::function<void_(const_char_*)>::~function(&this->m_backtraceCallback);
  std::function<void_()>::~function(&this->m_crashCallback);
  return;
}

Assistant:

PosixCrashHandler::~PosixCrashHandler() {
        free(m_stackMemory);
        free(m_demangleMemory);
    }